

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions::
~TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions
          (TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions *this)

{
  ~TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

inline void TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions::SharedDtor(MessageLite& self) {
  TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions& this_ = static_cast<TestChildExtensionData_NestedTestAllExtensionsData_NestedDynamicExtensions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}